

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::~ImplicitWeakMessage(ImplicitWeakMessage *this)

{
  ~ImplicitWeakMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

~ImplicitWeakMessage() PROTOBUF_FINAL { delete data_; }